

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O2

void PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *mod,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *val,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  long lVar1;
  pointer puVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  size_t x;
  ulong uVar7;
  long in_FS_OFFSET;
  Multiplier mul;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  puVar4 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (uVar7 <= (ulong)((long)puVar5 - (long)puVar4)) {
    do {
      uVar6 = (long)puVar5 - (long)puVar4;
      do {
        puVar5 = puVar5 + -1;
        if (uVar6 < uVar7) goto LAB_008e6bca;
        uVar3 = *puVar5;
        (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
        uVar6 = uVar6 - 4;
      } while (uVar3 == 0);
      RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Build<&LFSR<BitsInt<unsigned_int,32>,141u>::Call>
                ((RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)&mul,uVar3);
      for (uVar6 = 0;
          puVar2 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start,
          uVar6 < ((long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) - 1U;
          uVar6 = uVar6 + 1) {
        uVar3 = RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Map<BitsInt<unsigned_int,32>,0>
                          ((RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)&mul,puVar2[uVar6]);
        puVar4 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish + ((uVar6 + 1) - ((long)uVar7 >> 2));
        *puVar4 = *puVar4 ^ uVar3;
      }
      puVar4 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    } while( true );
  }
LAB_008e6bd3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
LAB_008e6bca:
  for (; (puVar5 + 1 != puVar4 && (*puVar5 == 0)); puVar5 = puVar5 + -1) {
    (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  goto LAB_008e6bd3;
}

Assistant:

void PolyMod(const std::vector<typename F::Elem>& mod, std::vector<typename F::Elem>& val, const F& field) {
    size_t modsize = mod.size();
    CHECK_SAFE(modsize > 0 && mod.back() == 1);
    if (val.size() < modsize) return;
    CHECK_SAFE(val.back() != 0);
    while (val.size() >= modsize) {
        auto term = val.back();
        val.pop_back();
        if (term != 0) {
            typename F::Multiplier mul(field, term);
            for (size_t x = 0; x < mod.size() - 1; ++x) {
                val[val.size() - modsize + 1 + x] ^= mul(mod[x]);
            }
        }
    }
    while (val.size() > 0 && val.back() == 0) val.pop_back();
}